

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cflags.h
# Opt level: O0

void cflags_parse(cflags_t *flags,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  void *pvVar3;
  undefined8 *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  char **tmp;
  cflags_flag_t *flag_1;
  cflags_flag_t *flag;
  char *divider;
  char *value;
  char *key;
  char *pch;
  int i;
  char *local_50;
  char *in_stack_ffffffffffffffb8;
  cflags_flag_t *in_stack_ffffffffffffffc0;
  undefined1 *local_38;
  char *local_28;
  int local_1c;
  
  *in_RDI = *in_RDX;
  local_1c = 1;
  do {
    if (in_ESI <= local_1c) {
      return;
    }
    pcVar1 = (char *)in_RDX[local_1c];
    if (*pcVar1 == '-') {
      local_28 = pcVar1 + 1;
      if (*local_28 == '-') {
        local_38 = (undefined1 *)0x0;
        in_stack_ffffffffffffffc0 = (cflags_flag_t *)strchr(pcVar1 + 2,0x3d);
        if (in_stack_ffffffffffffffc0 != (cflags_flag_t *)0x0) {
          in_stack_ffffffffffffffc0->short_name = '\0';
          local_38 = &in_stack_ffffffffffffffc0->field_0x1;
        }
        for (in_stack_ffffffffffffffb8 = (char *)in_RDI[3]; in_stack_ffffffffffffffb8 != (char *)0x0
            ; in_stack_ffffffffffffffb8 = *(char **)(in_stack_ffffffffffffffb8 + 0x20)) {
          iVar2 = strcmp(*(char **)(in_stack_ffffffffffffffb8 + 8),pcVar1 + 2);
          if (iVar2 == 0) {
            if (local_38 == (undefined1 *)0x0) {
              if (local_1c + 1 < in_ESI) {
                if (((*(int *)(in_stack_ffffffffffffffb8 + 0x18) == 1) ||
                    (*(int *)(in_stack_ffffffffffffffb8 + 0x18) == 5)) ||
                   (*(char *)in_RDX[local_1c + 1] == '-')) {
                  _cflags_process_flag(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
                }
                else {
                  _cflags_process_flag(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
                  local_1c = local_1c + 1;
                }
              }
              else {
                _cflags_process_flag(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
              }
            }
            else {
              _cflags_process_flag(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
            }
            break;
          }
        }
      }
      else {
        for (; *local_28 != '\0'; local_28 = local_28 + 1) {
          for (local_50 = (char *)in_RDI[3]; local_50 != (char *)0x0;
              local_50 = *(char **)(local_50 + 0x20)) {
            if (*local_50 == *local_28) {
              if (local_1c + 1 < in_ESI) {
                if (((*(int *)(local_50 + 0x18) == 1) || (*(int *)(local_50 + 0x18) == 5)) ||
                   (*(char *)in_RDX[local_1c + 1] == '-')) {
                  _cflags_process_flag(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
                }
                else {
                  _cflags_process_flag(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
                  local_1c = local_1c + 1;
                }
              }
              else {
                _cflags_process_flag(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
              }
              break;
            }
          }
        }
      }
    }
    else {
      *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + 1;
      pvVar3 = realloc((void *)in_RDI[2],(long)*(int *)(in_RDI + 1) << 3);
      if (pvVar3 == (void *)0x0) {
        fprintf(_stderr,"cflags: out of memory");
        return;
      }
      in_RDI[2] = pvVar3;
      *(char **)(in_RDI[2] + (long)(*(int *)(in_RDI + 1) + -1) * 8) = pcVar1;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static void cflags_parse(cflags_t * flags, int argc, char ** argv)
{
    flags->program = argv[0];

    for (int i = 1; i < argc; ++i) {
        char * pch = argv[i];
        if (*pch == '-') {
            ++pch;
            if (*pch == '-') {
                ++pch;

                // Long
                char * key = pch;
                char * value = NULL;

                char * divider = strchr(pch, '=');
                if (divider) {
                    *divider = '\0';
                    value = divider + 1;
                }

                cflags_flag_t * flag = flags->first_flag;
                while (flag) {
                    if (strcmp(flag->long_name, key) == 0) {
                        if (value) {
                            _cflags_process_flag(flag, value);
                        }
                        else {
                            if (i + 1 >= argc) {
                                _cflags_process_flag(flag, NULL);
                            }
                            else {
                                if (flag->type == CFLAGS_TYPE_BOOL ||
                                    flag->type == CFLAGS_TYPE_BOOL_CALLBACK ||
                                    argv[i + 1][0] == '-') {
                                    _cflags_process_flag(flag, NULL);
                                }
                                else {
                                    _cflags_process_flag(flag, argv[i + 1]);
                                    ++i;
                                }
                            }
                        }
                        break;
                    }
                    flag = flag->next;
                }
            }
            else {
                while (*pch) {
                    // Short
                    cflags_flag_t * flag = flags->first_flag;
                    while (flag) {
                        if (flag->short_name == *pch) {
                            if (i + 1 >= argc) {
                                _cflags_process_flag(flag, NULL);
                            }
                            else {
                                if (flag->type == CFLAGS_TYPE_BOOL ||
                                    flag->type == CFLAGS_TYPE_BOOL_CALLBACK ||
                                    argv[i + 1][0] == '-') {
                                    _cflags_process_flag(flag, NULL);
                                }
                                else {
                                    _cflags_process_flag(flag, argv[i + 1]);
                                    ++i;
                                }
                            }
                            break;
                        }
                        flag = flag->next;
                    }
                    ++pch;
                }
            }
        }
        else {
            ++flags->argc;
            char ** tmp = (char **)realloc(flags->argv, flags->argc * sizeof(char *));
            if (!tmp) {
                fprintf(stderr, CFLAGS_ERROR_OOM);
                return;
            }
            flags->argv = tmp;
            flags->argv[flags->argc - 1] = pch;
        }
    }
}